

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall Graph::show_node_info(Graph *this)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"idx,x,y,demand,tw_open,tw_close,unload_time",0x2b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (0 < this->num_node) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(int *)((long)&this->nodes->idx + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->x + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->y + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)
               std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->demand + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)
               std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->tw_open + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)
               std::ostream::operator<<(poVar1,*(int *)((long)&this->nodes->tw_close + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      plVar2 = (long *)std::ostream::operator<<
                                 (poVar1,*(int *)((long)&this->nodes->unload_time + lVar4));
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < this->num_node);
  }
  return;
}

Assistant:

void Graph::show_node_info() const
{
	std::cout << std::endl << "idx,x,y,demand,tw_open,tw_close,unload_time" << std::endl;
	for(int i = 0; i < num_node; i++){
		std::cout << nodes[i].idx << " " << nodes[i].x << " " << nodes[i].y << " " << nodes[i].demand << \
			" " << nodes[i].tw_open << " " << nodes[i].tw_close << " " << nodes[i].unload_time << std::endl;
	}
}